

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::ClearRenderTarget
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,ITextureView *pView)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Uint32 i;
  ulong uVar4;
  COMMAND_QUEUE_TYPE in_DL;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  char *in_R8;
  char (*in_R9) [8];
  bool bVar5;
  string msg;
  String local_48;
  char (*Args) [21];
  
  if (pView == (ITextureView *)0x0) {
    FormatString<char[45]>(&msg,(char (*) [45])"Render target view to clear must not be null");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x65a);
    std::__cxx11::string::~string((string *)&msg);
    in_DL = extraout_DL;
  }
  CVar2 = (this->m_Desc).QueueType;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&msg,(char (*) [79])
                      "Queue type may never be unknown for immediate contexts. This looks like a bug."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ClearRenderTarget",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x65b);
      std::__cxx11::string::~string((string *)&msg);
    }
    FormatString<char[97]>
              (&msg,(char (*) [97])
                    "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x65b);
    std::__cxx11::string::~string((string *)&msg);
    CVar2 = (this->m_Desc).QueueType;
    in_DL = extraout_DL_00;
  }
  if ((~CVar2 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_48,(Diligent *)(ulong)CVar2,in_DL);
    in_R8 = " queue.";
    FormatString<char[18],char[22],std::__cxx11::string,char[8]>
              (&msg,(Diligent *)"ClearRenderTarget",(char (*) [18])0x65e20a,(char (*) [22])&local_48
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9
              );
    std::__cxx11::string::~string((string *)&local_48);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x65b);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar3 = (*(pView->super_IDeviceObject).super_IObject._vptr_IObject[4])(pView);
  Args = (char (*) [21])CONCAT44(extraout_var,iVar3);
  if ((*Args)[8] != TEXTURE_VIEW_RENDER_TARGET) {
    local_48._M_dataplus._M_p = GetTexViewTypeLiteralName((*Args)[8]);
    iVar3 = (*(pView->super_IDeviceObject).super_IObject._vptr_IObject[4])(pView);
    in_R8 = (char *)CONCAT44(extraout_var_00,iVar3);
    FormatString<char[11],char_const*,char[20],char_const*,char[97]>
              (&msg,(Diligent *)"The type (",(char (*) [11])&local_48,
               (char **)") of texture view \'",(char (*) [20])in_R8,
               (char **)
               "\' is invalid: ClearRenderTarget command expects render target view (TEXTURE_VIEW_RENDER_TARGET)."
               ,(char (*) [97])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x662);
    std::__cxx11::string::~string((string *)&msg);
  }
  bVar5 = false;
  for (uVar4 = 0; (!bVar5 && (uVar4 < this->m_NumBoundRenderTargets)); uVar4 = uVar4 + 1) {
    bVar5 = this->m_pBoundRenderTargets[uVar4].m_pObject == (TextureViewVkImpl *)pView;
  }
  if (!bVar5) {
    if ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0) {
      FormatString<char[21],char_const*,char[158]>
                (&msg,(Diligent *)"Render target view \'",Args,
                 (char **)
                 "\' is not bound as framebuffer attachment. ClearRenderTarget command inside a render pass requires render target view to be bound as a framebuffer attachment."
                 ,(char (*) [158])in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ClearRenderTarget",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x66f);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((((this->m_pDevice).m_pObject)->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Type -
        RENDER_DEVICE_TYPE_GL < 2) {
      FormatString<char[21],char_const*,char[144]>
                (&msg,(Diligent *)"Render target view \'",Args,
                 (char **)
                 "\' is not bound to the device context. ClearRenderTarget command requires render target view to be bound to the device context in OpenGL backend"
                 ,(char (*) [144])in_R8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
    }
    else {
      FormatString<char[21],char_const*,char[191]>
                (&msg,(Diligent *)"Render target view \'",Args,
                 (char **)
                 "\' is not bound to the device context. ClearRenderTarget command is more efficient if render target view is bound to the device context. In OpenGL, Metal and WebGPU backends this is required."
                 ,(char (*) [191])in_R8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
      }
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  pUVar1 = &(this->m_Stats).CommandCounters.ClearRenderTarget;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::ClearRenderTarget(ITextureView* pView)
{
    DEV_CHECK_ERR(pView != nullptr, "Render target view to clear must not be null");
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "ClearRenderTarget");

#ifdef DILIGENT_DEVELOPMENT
    {
        const TextureViewDesc& ViewDesc = pView->GetDesc();
        DEV_CHECK_ERR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET,
                      "The type (", GetTexViewTypeLiteralName(ViewDesc.ViewType), ") of texture view '", pView->GetDesc().Name,
                      "' is invalid: ClearRenderTarget command expects render target view (TEXTURE_VIEW_RENDER_TARGET).");

        bool RTFound = false;
        for (Uint32 i = 0; i < m_NumBoundRenderTargets && !RTFound; ++i)
        {
            RTFound = m_pBoundRenderTargets[i] == pView;
        }

        if (!RTFound)
        {
            DEV_CHECK_ERR(m_pActiveRenderPass == nullptr,
                          "Render target view '", ViewDesc.Name,
                          "' is not bound as framebuffer attachment. ClearRenderTarget command inside a render pass "
                          "requires render target view to be bound as a framebuffer attachment.");

            if (m_pDevice->GetDeviceInfo().IsGLDevice())
            {
                LOG_ERROR_MESSAGE("Render target view '", ViewDesc.Name,
                                  "' is not bound to the device context. ClearRenderTarget command "
                                  "requires render target view to be bound to the device context in OpenGL backend");
            }
            else
            {
                LOG_DVP_WARNING_MESSAGE("Render target view '", ViewDesc.Name,
                                        "' is not bound to the device context. ClearRenderTarget command is more efficient "
                                        "if render target view is bound to the device context. In OpenGL, Metal and WebGPU backends this is required.");
            }
        }
    }
#endif

    ++m_Stats.CommandCounters.ClearRenderTarget;
}